

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *p,char *pCur,char *format,...)

{
  char in_AL;
  char *__s;
  size_t sVar1;
  long lVar2;
  undefined8 in_RCX;
  ulong uVar3;
  long lVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &args[0].overflow_arg_area;
  local_e8.gp_offset = 0x18;
  local_e8.fp_offset = 0x30;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  __s = vnsprintf(format,&local_e8);
  sVar1 = strlen(__s);
  if (899 < sVar1) {
    __assert_fail("strlen(pMessage) < WLV_PRS_MAX_LINE - 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x89,"int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *, char *, const char *, ...)");
  }
  if (p->sError[0] != '\0') {
    __assert_fail("p->sError[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x8a,"int Wlc_PrsWriteErrorMessage(Wlc_Prs_t *, char *, const char *, ...)");
  }
  if (pCur == (char *)0x0) {
    sprintf(p->sError,"%s: %s\n",p->pFileName,__s);
  }
  else {
    lVar2 = (long)p->vLines->nSize;
    uVar3 = 0xffffffff;
    if (0 < lVar2) {
      lVar4 = 0;
      do {
        if ((long)pCur - (long)p->pBuffer < (long)p->vLines->pArray[lVar4]) {
          uVar3 = (ulong)((int)lVar4 + 1);
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
    }
    sprintf(p->sError,"%s (line %d): %s\n",p->pFileName,uVar3,__s);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return 0;
}

Assistant:

int Wlc_PrsWriteErrorMessage( Wlc_Prs_t * p, char * pCur, const char * format, ... )
{
    char * pMessage;
    // derive message
    va_list args;
    va_start( args, format );
    pMessage = vnsprintf( format, args );
    va_end( args );
    // print messsage
    assert( strlen(pMessage) < WLV_PRS_MAX_LINE - 100 );
    assert( p->sError[0] == 0 );
    if ( pCur == NULL ) // the line number is not given
        sprintf( p->sError, "%s: %s\n", p->pFileName, pMessage );
    else                // print the error message with the line number
    {
        int iLine = Wlc_PrsFindLine( p, pCur );
        sprintf( p->sError, "%s (line %d): %s\n", p->pFileName, iLine, pMessage );
    }
    ABC_FREE( pMessage );
    return 0;
}